

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawPartialSprite
          (PixelGameEngine *this,int32_t x,int32_t y,Sprite *sprite,int32_t ox,int32_t oy,int32_t w,
          int32_t h,uint32_t scale,uint8_t flip)

{
  Pixel PVar1;
  int local_5c;
  int local_58;
  int32_t j_1;
  int32_t i_1;
  uint local_4c;
  uint32_t js;
  uint32_t is;
  int32_t j;
  int32_t i;
  int32_t fy;
  int32_t fym;
  int32_t fys;
  int32_t fx;
  int32_t fxm;
  int32_t fxs;
  int32_t oy_local;
  int32_t ox_local;
  Sprite *sprite_local;
  int32_t y_local;
  int32_t x_local;
  PixelGameEngine *this_local;
  
  if (sprite != (Sprite *)0x0) {
    fx = 0;
    fys = 1;
    fy = 0;
    i = 1;
    if ((flip & 1) != 0) {
      fx = w + -1;
      fys = -1;
    }
    if ((flip & 2) != 0) {
      fy = h + -1;
      i = -1;
    }
    if (scale < 2) {
      fym = fx;
      for (local_58 = 0; local_58 < w; local_58 = local_58 + 1) {
        j = fy;
        for (local_5c = 0; local_5c < h; local_5c = local_5c + 1) {
          PVar1 = Sprite::GetPixel(sprite,fym + ox,j + oy);
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)(x + local_58),(ulong)(uint)(y + local_5c),
                     (ulong)(uint)PVar1.field_0);
          j = i + j;
        }
        fym = fys + fym;
      }
    }
    else {
      fym = fx;
      for (is = 0; (int)is < w; is = is + 1) {
        j = fy;
        for (js = 0; (int)js < h; js = js + 1) {
          for (local_4c = 0; local_4c < scale; local_4c = local_4c + 1) {
            for (i_1 = 0; (uint)i_1 < scale; i_1 = i_1 + 1) {
              PVar1 = Sprite::GetPixel(sprite,fym + ox,j + oy);
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(x + is * scale + local_4c),(ulong)(y + js * scale + i_1),
                         (ulong)(uint)PVar1.field_0);
            }
          }
          j = i + j;
        }
        fym = fys + fym;
      }
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawPartialSprite(int32_t x, int32_t y, Sprite *sprite, int32_t ox, int32_t oy, int32_t w, int32_t h, uint32_t scale, uint8_t flip)
	{
		if (sprite == nullptr)
			return;

		int32_t fxs = 0, fxm = 1, fx = 0;
		int32_t fys = 0, fym = 1, fy = 0;
		if (flip & olc::Sprite::Flip::HORIZ)
		{
			fxs = w - 1;
			fxm = -1;
		}
		if (flip & olc::Sprite::Flip::VERT)
		{
			fys = h - 1;
			fym = -1;
		}

		if (scale > 1)
		{
			fx = fxs;
			for (int32_t i = 0; i < w; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < h; j++, fy += fym)
					for (uint32_t is = 0; is < scale; is++)
						for (uint32_t js = 0; js < scale; js++)
							Draw(x + (i * scale) + is, y + (j * scale) + js, sprite->GetPixel(fx + ox, fy + oy));
			}
		}
		else
		{
			fx = fxs;
			for (int32_t i = 0; i < w; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < h; j++, fy += fym)
					Draw(x + i, y + j, sprite->GetPixel(fx + ox, fy + oy));
			}
		}
	}